

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector3 * vector3_rotate_by_quaternion(vector3 *self,quaternion *qT)

{
  undefined1 local_38 [8];
  quaternion q;
  quaternion qconj;
  quaternion *qT_local;
  vector3 *self_local;
  
  quaternion_set((quaternion *)((long)&q.field_0 + 8),qT);
  quaternion_conjugate((quaternion *)((long)&q.field_0 + 8));
  quaternion_set((quaternion *)local_38,qT);
  quaternion_multiplyv3((quaternion *)local_38,self);
  quaternion_multiply((quaternion *)local_38,(quaternion *)((long)&q.field_0 + 8));
  (self->field_0).v[0] = (float)local_38._0_4_;
  (self->field_0).v[1] = (float)local_38._4_4_;
  (self->field_0).v[2] = q.field_0.q[0];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_rotate_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion qconj;
	struct quaternion q;

	/* make the conjugate */
	quaternion_set(&qconj, qT);
	quaternion_conjugate(&qconj);

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, &qconj);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}